

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::(anonymous_namespace)::SymbolByFullNameEq::operator()
          (void *this,Symbol *a,FullNameQuery *b)

{
  bool bVar1;
  string_view __x;
  string_view __y;
  FullNameQuery *b_local;
  Symbol *a_local;
  SymbolByFullNameEq *this_local;
  
  __x = Symbol::full_name(a);
  __y = anon_unknown_24::FullNameQuery::full_name(b);
  bVar1 = std::operator==(__x,__y);
  return bVar1;
}

Assistant:

bool operator()(const T& a, const U& b) const {
    return a.full_name() == b.full_name();
  }